

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBlock * ParseBlock(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  Lexeme *end;
  IntrusiveList<SynBase> expressions;
  SynBlock *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_ofigure) {
    ctx->currentLexeme = begin + 1;
    if (0xff < ctx->statementBlockDepth) {
      anon_unknown.dwarf_1519a::Stop(ctx,begin + 1,"ERROR: reached nested \'{\' limit of %d",0x100);
    }
    ctx->statementBlockDepth = ctx->statementBlockDepth + 1;
    expressions = ParseExpressions(ctx);
    ctx->statementBlockDepth = ctx->statementBlockDepth - 1;
    anon_unknown.dwarf_1519a::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynBlock *)CONCAT44(extraout_var,iVar1);
    end = ParseContext::Previous(ctx);
    SynBlock::SynBlock(this,begin,end,expressions);
  }
  else {
    this = (SynBlock *)0x0;
  }
  return this;
}

Assistant:

SynBlock* ParseBlock(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		const unsigned blockLimit = 256;

		if(ctx.statementBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '{' limit of %d", blockLimit);

		ctx.statementBlockDepth++;

		IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

		ctx.statementBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		return new (ctx.get<SynBlock>()) SynBlock(start, ctx.Previous(), expressions);
	}

	return NULL;
}